

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

list_elem * list_remove_reverse(list *list,list_elem *e)

{
  list_elem *e_local;
  list *list_local;
  list_elem *local_8;
  
  if (e == (list_elem *)0x0) {
    local_8 = (list_elem *)0x0;
  }
  else {
    if (e->next != (list_elem *)0x0) {
      e->next->prev = e->prev;
    }
    if (e->prev != (list_elem *)0x0) {
      e->prev->next = e->next;
    }
    if (list->head == e) {
      list->head = e->next;
    }
    if (list->tail == e) {
      list->tail = e->prev;
    }
    local_8 = e->prev;
  }
  return local_8;
}

Assistant:

struct list_elem *list_remove_reverse(struct list *list, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    if (e) {
        // if not NULL
        if (e->next) e->next->prev = e->prev;
        if (e->prev) e->prev->next = e->next;

        if (list->head == e) list->head = e->next;
        if (list->tail == e) list->tail = e->prev;

        IFDEF_LOCK( spin_unlock(&list->lock); );
        return e->prev;
    }
    // NULL .. do nothing
    IFDEF_LOCK( spin_unlock(&list->lock); );
    return NULL;
}